

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlSetNsProp(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlNodePtr pxVar3;
  xmlChar *local_58;
  _xmlNode *local_40;
  xmlNodePtr tmp;
  xmlAttrPtr prop;
  xmlChar *value_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  
  if ((ns == (xmlNsPtr)0x0) || (ns->href != (xmlChar *)0x0)) {
    if (ns == (xmlNsPtr)0x0) {
      local_58 = (xmlChar *)0x0;
    }
    else {
      local_58 = ns->href;
    }
    node_local = (xmlNodePtr)xmlGetPropNodeInternal(node,name,local_58,0);
    if (node_local == (xmlNodePtr)0x0) {
      node_local = (xmlNodePtr)xmlNewPropInternal(node,ns,name,value,0);
    }
    else {
      if (*(xmlAttributeType *)&node_local->content == XML_ATTRIBUTE_ID) {
        xmlRemoveID(node->doc,(xmlAttrPtr)node_local);
        *(xmlAttributeType *)&node_local->content = XML_ATTRIBUTE_ID;
      }
      if (node_local->children != (_xmlNode *)0x0) {
        xmlFreeNodeList(node_local->children);
      }
      node_local->children = (_xmlNode *)0x0;
      node_local->last = (_xmlNode *)0x0;
      node_local->ns = ns;
      if (value != (xmlChar *)0x0) {
        iVar1 = xmlCheckUTF8(value);
        if ((iVar1 == 0) &&
           (xmlTreeErr(0x517,(xmlNodePtr)node->doc,(char *)0x0), node->doc != (_xmlDoc *)0x0)) {
          pxVar2 = xmlStrdup((xmlChar *)"ISO-8859-1");
          node->doc->encoding = pxVar2;
        }
        pxVar3 = xmlNewDocText(node->doc,value);
        node_local->children = pxVar3;
        node_local->last = (_xmlNode *)0x0;
        for (local_40 = node_local->children; local_40 != (_xmlNode *)0x0; local_40 = local_40->next
            ) {
          local_40->parent = node_local;
          if (local_40->next == (_xmlNode *)0x0) {
            node_local->last = local_40;
          }
        }
      }
      if (*(int *)&node_local->content == 2) {
        xmlAddID((xmlValidCtxtPtr)0x0,node->doc,value,(xmlAttrPtr)node_local);
      }
    }
  }
  else {
    node_local = (xmlNodePtr)0x0;
  }
  return (xmlAttrPtr)node_local;
}

Assistant:

xmlAttrPtr
xmlSetNsProp(xmlNodePtr node, xmlNsPtr ns, const xmlChar *name,
	     const xmlChar *value)
{
    xmlAttrPtr prop;

    if (ns && (ns->href == NULL))
	return(NULL);
    prop = xmlGetPropNodeInternal(node, name, (ns != NULL) ? ns->href : NULL, 0);
    if (prop != NULL) {
	/*
	* Modify the attribute's value.
	*/
	if (prop->atype == XML_ATTRIBUTE_ID) {
	    xmlRemoveID(node->doc, prop);
	    prop->atype = XML_ATTRIBUTE_ID;
	}
	if (prop->children != NULL)
	    xmlFreeNodeList(prop->children);
	prop->children = NULL;
	prop->last = NULL;
	prop->ns = ns;
	if (value != NULL) {
	    xmlNodePtr tmp;

	    if(!xmlCheckUTF8(value)) {
	        xmlTreeErr(XML_TREE_NOT_UTF8, (xmlNodePtr) node->doc,
	                   NULL);
                if (node->doc != NULL)
                    node->doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
	    }
	    prop->children = xmlNewDocText(node->doc, value);
	    prop->last = NULL;
	    tmp = prop->children;
	    while (tmp != NULL) {
		tmp->parent = (xmlNodePtr) prop;
		if (tmp->next == NULL)
		    prop->last = tmp;
		tmp = tmp->next;
	    }
	}
	if (prop->atype == XML_ATTRIBUTE_ID)
	    xmlAddID(NULL, node->doc, value, prop);
	return(prop);
    }
    /*
    * No equal attr found; create a new one.
    */
    return(xmlNewPropInternal(node, ns, name, value, 0));
}